

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblySource.cpp
# Opt level: O3

void __thiscall
Js::WebAssemblySource::CreateSourceInfo
          (WebAssemblySource *this,bool createNewContext,ScriptContext *scriptContext)

{
  uint uVar1;
  SourceContextInfo *pSVar2;
  Utf8SourceInfo *sourceInfo;
  undefined7 in_register_00000031;
  SRCINFO *srcInfo;
  uint length;
  SRCINFO local_50;
  
  Memory::Recycler::WBSetBit((char *)&local_50);
  local_50.sourceContextInfo.ptr = (SourceContextInfo *)0x0;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
  local_50.ichLimHost = 0;
  local_50.ulCharOffset = 0;
  local_50.moduleID = 0;
  local_50.grfsi = 0;
  local_50.dlnHost = 0;
  local_50.ulColumnHost = 0;
  local_50.lnMinHost = 0;
  local_50.ichMinHost = 0;
  srcInfo = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->cache).
            noContextGlobalSourceInfo.ptr;
  if (((int)CONCAT71(in_register_00000031,createNewContext) != 0) && (DAT_015932e1 == '\x01')) {
    uVar1 = ScriptContext::GetNextSourceContextId(scriptContext);
    pSVar2 = ScriptContext::CreateSourceContextInfo
                       (scriptContext,(ulong)uVar1,(char16 *)0x0,0,(SimpleDataCacheWrapper *)0x0,
                        (char16 *)0x0,0);
    Memory::Recycler::WBSetBit((char *)&local_50);
    local_50.sourceContextInfo.ptr = pSVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
    srcInfo = &local_50;
  }
  length = this->bufferLength >> 1;
  sourceInfo = Utf8SourceInfo::NewWithNoCopy
                         (scriptContext,this->buffer,length,(ulong)this->bufferLength,srcInfo,true,
                          (Var)0x0);
  this->sourceInfo = sourceInfo;
  ScriptContext::SaveSourceNoCopy(scriptContext,sourceInfo,length,false);
  return;
}

Assistant:

void WebAssemblySource::CreateSourceInfo(bool createNewContext, ScriptContext* scriptContext)
{
    SRCINFO si = {
        /* sourceContextInfo   */ nullptr,
        /* dlnHost             */ 0,
        /* ulColumnHost        */ 0,
        /* lnMinHost           */ 0,
        /* ichMinHost          */ 0,
        /* ichLimHost          */ 0,
        /* ulCharOffset        */ 0,
        /* mod                 */ 0,
        /* grfsi               */ 0
    };
    SRCINFO const * srcInfo = scriptContext->Cache()->noContextGlobalSourceInfo;
    if (createNewContext && CONFIG_FLAG(WasmAssignModuleID))
    {
        // It is not legal to assign a SourceContextInfo on dynamic code, but it is usefull for debugging
        // Only do it if the specified as a test config
        si.sourceContextInfo = scriptContext->CreateSourceContextInfo(scriptContext->GetNextSourceContextId(), nullptr, 0, nullptr);
        srcInfo = &si;
    }

    // Note: We don't have real "source info" for Wasm. Following are just placeholders.
    // Hack: Wasm handles debugging differently. Fake this as "LibraryCode" so that
    // normal script debugging code ignores this source info and its functions.
    const int32 cchLength = static_cast<int32>(bufferLength / sizeof(char16));
    sourceInfo = Utf8SourceInfo::NewWithNoCopy(
        scriptContext, (LPCUTF8)buffer, cchLength, bufferLength, srcInfo, /*isLibraryCode*/true);
    scriptContext->SaveSourceNoCopy(sourceInfo, cchLength, /*isCesu8*/false);
}